

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.cc
# Opt level: O2

bool __thiscall
TypeFactory::setFields
          (TypeFactory *this,vector<TypeField,_std::allocator<TypeField>_> *fd,TypeStruct *ot,
          int4 fixedsize)

{
  int iVar1;
  pointer pTVar2;
  pointer pTVar3;
  LowlevelError *this_00;
  uint uVar4;
  pointer pTVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  pointer pTVar9;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  pTVar3 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_finish;
  uVar8 = 0;
  pTVar2 = (fd->super__Vector_base<TypeField,_std::allocator<TypeField>_>)._M_impl.
           super__Vector_impl_data._M_start;
  for (pTVar9 = pTVar2; pTVar9 != pTVar3; pTVar9 = pTVar9 + 1) {
    if ((pTVar9->type->metatype == TYPE_VOID) || ((pTVar9->name)._M_string_length == 0))
    goto LAB_002ad53b;
    if ((pTVar9->offset != -1) &&
       (uVar4 = pTVar9->offset + pTVar9->type->size, (int)uVar8 < (int)uVar4)) {
      uVar8 = uVar4;
    }
  }
  uVar4 = this->align;
  for (pTVar5 = pTVar2; pTVar5 != pTVar3; pTVar5 = pTVar5 + 1) {
    if (pTVar5->offset == -1) {
      uVar6 = 0;
      iVar1 = pTVar5->type->size;
      uVar7 = uVar4;
      if (1 < (int)uVar4) {
        do {
          uVar6 = uVar7;
          uVar7 = uVar6 >> 1;
        } while (iVar1 <= (int)uVar7);
        uVar6 = uVar6 - 1;
      }
      uVar7 = ((uVar8 + uVar6) - (uVar6 & uVar8)) + 1;
      if ((uVar6 & uVar8) == 0) {
        uVar7 = uVar8;
      }
      pTVar5->offset = uVar7;
      uVar8 = uVar7 + iVar1;
    }
  }
  std::
  __sort<__gnu_cxx::__normal_iterator<TypeField*,std::vector<TypeField,std::allocator<TypeField>>>,__gnu_cxx::__ops::_Iter_less_iter>
            (pTVar2,pTVar3);
  local_50._M_dataplus._M_p = (pointer)ot;
  std::
  _Rb_tree<Datatype_*,_Datatype_*,_std::_Identity<Datatype_*>,_DatatypeCompare,_std::allocator<Datatype_*>_>
  ::erase(&(this->tree)._M_t,(key_type *)&local_50);
  TypeStruct::setFields(ot,fd);
  if (0 < fixedsize) {
    uVar8 = (ot->super_Datatype).size;
    if ((int)uVar8 < fixedsize) {
      (ot->super_Datatype).size = fixedsize;
    }
    else if ((uint)fixedsize < uVar8) {
      this_00 = (LowlevelError *)__cxa_allocate_exception(0x20);
      std::operator+(&local_50,"Trying to force too small a size on ",&(ot->super_Datatype).name);
      LowlevelError::LowlevelError(this_00,&local_50);
      __cxa_throw(this_00,&LowlevelError::typeinfo,LowlevelError::~LowlevelError);
    }
  }
  local_50._M_dataplus._M_p = (pointer)ot;
  std::
  _Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
  ::_M_insert_unique<Datatype*>
            ((_Rb_tree<Datatype*,Datatype*,std::_Identity<Datatype*>,DatatypeCompare,std::allocator<Datatype*>>
              *)&this->tree,(Datatype **)&local_50);
LAB_002ad53b:
  return pTVar9 == pTVar3;
}

Assistant:

bool TypeFactory::setFields(vector<TypeField> &fd,TypeStruct *ot,int4 fixedsize)

{
  int4 offset,cursize,curalign;

  offset = 0;
  vector<TypeField>::iterator iter;

  // Find the maximum offset, from the explicitly set offsets
  for(iter=fd.begin();iter!=fd.end();++iter) {
    Datatype *ct = (*iter).type;
    // Do some sanity checks on the field
    if (ct->getMetatype() == TYPE_VOID) return false;
    if ((*iter).name.size() == 0) return false;

    if ((*iter).offset != -1) {
      int4 end = (*iter).offset + ct->getSize();
      if (end > offset)
	offset = end;
    }
  }

  // Assign offsets, respecting alignment, where not explicitly set
  for(iter=fd.begin();iter!=fd.end();++iter) {
    if ((*iter).offset != -1) continue;
    cursize = (*iter).type->getSize();
    curalign = 0;
    if (align > 1) {
      curalign = align;
      while((curalign>>1) >= cursize)
	curalign >>= 1;
      curalign -= 1;
    }
    if ((offset & curalign)!=0)
      offset = (offset-(offset & curalign) + (curalign+1));
    (*iter).offset = offset;
    offset += cursize;
  }

  sort(fd.begin(),fd.end());	// Sort fields by offset

  // We could check field overlapping here

  tree.erase(ot);
  ot->setFields(fd);
  if (fixedsize > 0) {		// If the caller is trying to force a size
    if (fixedsize > ot->size)	// If the forced size is bigger than the size required for fields
      ot->size = fixedsize;	//     Force the bigger size
    else if (fixedsize < ot->size) // If the forced size is smaller, this is an error
      throw LowlevelError("Trying to force too small a size on "+ot->getName());
  }
  tree.insert(ot);
  return true;
}